

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction
          (ReplaceInvalidOpcodePass *this,Instruction *inst,char *source,uint32_t line_number,
          uint32_t column_number)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t before;
  spv_position_t local_68;
  string message;
  
  uVar2 = Instruction::result_id(inst);
  if (uVar2 != 0) {
    uVar2 = Instruction::type_id(inst);
    uVar2 = GetSpecialConstant(this,uVar2);
    IRContext::KillNamesAndDecorates((this->super_Pass).context_,inst);
    this_00 = (this->super_Pass).context_;
    before = Instruction::result_id(inst);
    IRContext::ReplaceAllUsesWith(this_00,before,uVar2);
  }
  bVar1 = Instruction::IsBlockTerminator(inst);
  if (!bVar1) {
    if ((this->super_Pass).consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
      BuildWarningMessage_abi_cxx11_(&message,this,inst->opcode_);
      local_68.line = (size_t)line_number;
      local_68.index = 0;
      local_68.column = (ulong)column_number;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_Pass).consumer_,SPV_MSG_WARNING,source,&local_68,
                   message._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
    IRContext::KillInst((this->super_Pass).context_,inst);
    return;
  }
  __assert_fail("!inst->IsBlockTerminator() && \"We cannot simply delete a block terminator.  It must be replaced \" \"with something.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                ,0xac,
                "void spvtools::opt::ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction *, const char *, uint32_t, uint32_t)"
               );
}

Assistant:

void ReplaceInvalidOpcodePass::ReplaceInstruction(Instruction* inst,
                                                  const char* source,
                                                  uint32_t line_number,
                                                  uint32_t column_number) {
  if (inst->result_id() != 0) {
    uint32_t const_id = GetSpecialConstant(inst->type_id());
    context()->KillNamesAndDecorates(inst);
    context()->ReplaceAllUsesWith(inst->result_id(), const_id);
  }
  assert(!inst->IsBlockTerminator() &&
         "We cannot simply delete a block terminator.  It must be replaced "
         "with something.");
  if (consumer()) {
    std::string message = BuildWarningMessage(inst->opcode());
    consumer()(SPV_MSG_WARNING, source, {line_number, column_number, 0},
               message.c_str());
  }
  context()->KillInst(inst);
}